

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O0

void ACustomSprite::InPlaceConstructor(void *mem)

{
  ACustomSprite *this;
  void *mem_local;
  
  this = (ACustomSprite *)DObject::operator_new(0x4c0,(EInPlace *)mem);
  ACustomSprite(this);
  return;
}

Assistant:

void ACustomSprite::BeginPlay ()
{
	char name[9];
	Super::BeginPlay ();

	mysnprintf (name, countof(name), "BTIL%04d", args[0] & 0xffff);
	picnum = TexMan.GetTexture (name, FTexture::TEX_Build);

	Scale.X = args[2] / 64.;
	Scale.Y = args[3] / 64.;

	int cstat = args[4];
	if (cstat & 2)
	{
		RenderStyle = STYLE_Translucent;
		Alpha = (cstat & 512) ? 0.6666 : 0.3333;
	}
	if (cstat & 4)
		renderflags |= RF_XFLIP;
	if (cstat & 8)
		renderflags |= RF_YFLIP;

	// set face/wall/floor flags
	renderflags |= ActorRenderFlags::FromInt (((cstat >> 4) & 3) << 12);
}